

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O3

bool __thiscall Glucose::ClausesBuffer::pushClause(ClausesBuffer *this,int threadId,Clause *c)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = (uint)((ulong)*(undefined8 *)&c->header >> 0x20);
  if (this->whenFullRemoveOlder == true) {
    uVar5 = this->maxsize;
    uVar3 = this->queuesize + uVar2 + 3;
  }
  else {
    uVar3 = this->queuesize + uVar2 + 3;
    uVar5 = this->maxsize;
    if (uVar5 <= uVar3) {
      return false;
    }
  }
  if (uVar5 <= uVar3) {
    do {
      this->forcedRemovedClauses = this->forcedRemovedClauses + 1;
      removeLastClause(this);
      uVar2 = *(uint *)&(c->header).field_0x4;
    } while (this->maxsize <= this->queuesize + uVar2 + 3);
  }
  puVar1 = (this->elems).data;
  puVar1[(int)this->first] = uVar2;
  uVar2 = this->first + 1;
  if (uVar2 == this->maxsize) {
    uVar2 = 0;
  }
  this->first = uVar2;
  uVar5 = 1;
  if (1 < this->nbThreads) {
    uVar5 = this->nbThreads - 1;
  }
  puVar1[(int)uVar2] = uVar5;
  uVar2 = this->first + 1;
  if (uVar2 == this->maxsize) {
    uVar2 = 0;
  }
  this->first = uVar2;
  puVar1[(int)uVar2] = threadId;
  uVar2 = this->first + 1;
  if (uVar2 == this->maxsize) {
    uVar2 = 0;
  }
  this->first = uVar2;
  iVar6 = *(int *)&(c->header).field_0x4;
  if (0 < iVar6) {
    lVar4 = 0;
    do {
      puVar1[(int)uVar2] = *(uint *)(&c[1].header.field_0x0 + lVar4 * 4);
      uVar5 = this->first + 1;
      uVar2 = 0;
      if (uVar5 != this->maxsize) {
        uVar2 = uVar5;
      }
      this->first = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(long *)&c->header >> 0x20);
    iVar6 = (int)((ulong)*(long *)&c->header >> 0x20);
  }
  this->queuesize = this->queuesize + iVar6 + 3;
  return true;
}

Assistant:

bool ClausesBuffer::pushClause(int threadId, Clause & c) {
    if (!whenFullRemoveOlder && (queuesize + c.size() + headerSize >= maxsize))
	return false; // We need to remove some old clauses
    while (queuesize + c.size() + headerSize >= maxsize) { // We need to remove some old clauses
	forcedRemovedClauses ++;
	removeLastClause();
	assert(queuesize > 0);
    }
    noCheckPush(c.size());
    noCheckPush(nbThreads>1?nbThreads-1:1);
    noCheckPush(threadId);
    for(int i=0;i<c.size();i++)
	noCheckPush(toInt(c[i]));
    queuesize += c.size()+headerSize;
    return true;
    //  printf(" -> (%d, %d)\n", first, last);
}